

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpTestLog.c
# Opt level: O0

void qpTestLog_destroy(qpTestLog *log)

{
  qpTestLog *log_local;
  
  if (log->isSessionOpen != 0) {
    endSession(log);
  }
  if (log->writer != (qpXmlWriter *)0x0) {
    qpXmlWriter_destroy(log->writer);
  }
  if (log->outputFile != (FILE *)0x0) {
    fclose((FILE *)log->outputFile);
  }
  if (log->lock != 0) {
    deMutex_destroy(log->lock);
  }
  deFree(log);
  return;
}

Assistant:

void qpTestLog_destroy (qpTestLog* log)
{
	DE_ASSERT(log);

	if (log->isSessionOpen)
		endSession(log);

	if (log->writer)
		qpXmlWriter_destroy(log->writer);

	if (log->outputFile)
		fclose(log->outputFile);

	if (log->lock)
		deMutex_destroy(log->lock);

	deFree(log);
}